

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

int tcsicmp_ascii(tchar_t *a,tchar_t *b)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  lVar4 = 0;
  do {
    bVar1 = a[lVar4];
    uVar5 = (uint)(char)bVar1;
    bVar2 = b[lVar4];
    iVar6 = (int)(char)bVar2;
    if (bVar2 == bVar1) {
      if (bVar1 == 0) {
        return 0;
      }
    }
    else if (((uVar5 & 0xffffffdf) - 0x5b < 0xffffffe6) || (((bVar2 ^ bVar1) & 0xdf) != 0))
    goto LAB_00120538;
    bVar1 = a[lVar4 + 1];
    uVar5 = (uint)(char)bVar1;
    bVar2 = b[lVar4 + 1];
    iVar6 = (int)(char)bVar2;
    if (bVar2 == bVar1) {
      if (bVar1 == 0) {
        return 0;
      }
    }
    else if (((uVar5 & 0xffffffdf) - 0x5b < 0xffffffe6) || (((bVar2 ^ bVar1) & 0xdf) != 0))
    goto LAB_00120538;
    bVar1 = a[lVar4 + 2];
    uVar5 = (uint)(char)bVar1;
    bVar2 = b[lVar4 + 2];
    iVar6 = (int)(char)bVar2;
    if (bVar2 == bVar1) {
      if (bVar1 == 0) {
        return 0;
      }
    }
    else if (((uVar5 & 0xffffffdf) - 0x5b < 0xffffffe6) || (((bVar2 ^ bVar1) & 0xdf) != 0))
    goto LAB_00120538;
    bVar1 = a[lVar4 + 3];
    uVar5 = (uint)(char)bVar1;
    bVar2 = b[lVar4 + 3];
    iVar6 = (int)(char)bVar2;
    if (bVar2 == bVar1) {
      if (bVar1 == 0) {
        return 0;
      }
    }
    else if (((uVar5 & 0xffffffdf) - 0x5b < 0xffffffe6) || (((bVar2 ^ bVar1) & 0xdf) != 0)) {
LAB_00120538:
      uVar3 = uVar5 - 0x20;
      if (0x19 < uVar5 - 0x61) {
        uVar3 = uVar5;
      }
      iVar7 = iVar6 + -0x20;
      if (0x19 < iVar6 - 0x61U) {
        iVar7 = iVar6;
      }
      return uVar3 - iVar7;
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

int tcsicmp_ascii(const tchar_t* a,const tchar_t* b)
{
    int ca,cb;
    for (;;a+=4,b+=4)
    {
        icmp_ascii(a,b,0)
        icmp_ascii(a,b,1)
        icmp_ascii(a,b,2)
        icmp_ascii(a,b,3)
    }
    return ascii_upper(ca)-ascii_upper(cb);
}